

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O1

SHARED_P shared_lock(int idx,int mode)

{
  BLKHEAD *pBVar1;
  SHARED_LTAB *pSVar2;
  int iVar3;
  int *piVar4;
  
  iVar3 = shared_mux(idx,mode);
  if (iVar3 == 0) {
    if ((((shared_lt[idx].lkcnt == 0) || (iVar3 = shared_map(idx), iVar3 == 0)) &&
        ((shared_lt[idx].p != (BLKHEAD *)0x0 || (iVar3 = shared_map(idx), iVar3 == 0)))) &&
       (((pSVar2 = shared_lt, pBVar1 = shared_lt[idx].p, (pBVar1->s).ID[0] == 'J' &&
         (*(char *)((long)pBVar1 + 1) == 'B')) && (*(char *)((long)pBVar1 + 2) == '\x01')))) {
      piVar4 = &shared_lt[idx].lkcnt;
      if ((mode & 1U) != 0) {
        *piVar4 = -1;
        piVar4 = &shared_gt[idx].nprocdebug;
      }
      *piVar4 = *piVar4 + 1;
      pSVar2[idx].seekpos = 0;
      return pBVar1 + 1;
    }
    shared_demux(idx,mode);
  }
  return (SHARED_P)0x0;
}

Assistant:

SHARED_P shared_lock(int idx, int mode)         /* lock given segment for exclusive access */
 { int r;

   if (shared_mux(idx, mode))  return(NULL);    /* idx checked by shared_mux */
   if (0 != shared_lt[idx].lkcnt)               /* are we already locked ?? */
     if (SHARED_OK != (r = shared_map(idx)))
       { shared_demux(idx, mode); 
         return(NULL);
       }
   if (NULL == shared_lt[idx].p)                /* stupid pointer ?? */
     if (SHARED_OK != (r = shared_map(idx)))
       { shared_demux(idx, mode); 
         return(NULL);
       }
   if ((SHARED_ID_0 != (shared_lt[idx].p)->s.ID[0]) || (SHARED_ID_1 != (shared_lt[idx].p)->s.ID[1]) || (BLOCK_SHARED != (shared_lt[idx].p)->s.tflag))
     { shared_demux(idx, mode);
       return(NULL);
     }
   if (mode & SHARED_RDWRITE)
     { shared_lt[idx].lkcnt = -1;

       shared_gt[idx].nprocdebug++;
     }

   else shared_lt[idx].lkcnt++;
   shared_lt[idx].seekpos = 0L;                 /* r/w pointer positioned at beg of block */
   return((SHARED_P)((shared_lt[idx].p) + 1));
 }